

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::AssignStmt::clear(AssignStmt *this)

{
  enable_shared_from_this<kratos::Stmt> *__r;
  Var *pVVar1;
  shared_ptr<kratos::AssignStmt> sVar2;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  pVVar1 = this->left_;
  __r = &(this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
            (local_48,(__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)__r);
  sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)&stack0xffffffffffffffc8);
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x13])
            (pVVar1,&stack0xffffffffffffffc8,
             sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  pVVar1 = this->right_;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
            (local_48,(__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)__r);
  sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)&stack0xffffffffffffffc8);
  (*(pVVar1->super_IRNode)._vptr_IRNode[0xf])
            (pVVar1,&stack0xffffffffffffffc8,
             sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  (this->super_Stmt).parent_ = (IRNode *)0x0;
  return;
}

Assistant:

void AssignStmt::clear() {
    // remove it from source and sinks
    left_->remove_source(shared_from_this()->as<AssignStmt>());
    right_->remove_sink(shared_from_this()->as<AssignStmt>());
    parent_ = nullptr;
}